

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::ld_r_r<(SM83::Registers)2,(SM83::Registers)3>(SM83 *this)

{
  string_view fmt;
  format_args args;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_88[0] = (ulong)(this->field_0).af;
  local_78 = (ulong)(this->field_1).bc;
  local_68 = (ulong)(this->field_2).de;
  local_58 = (ulong)(this->field_3).hl;
  local_48 = (ulong)this->sp;
  local_38 = (ulong)this->pc_at_opcode;
  local_28 = 0x42;
  local_18 = 0x43;
  fmt.size_ = 0x47;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD {}, {}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_88;
  args.desc_ = 0x88222222;
  ::fmt::v11::vprint(fmt,args);
  (this->field_1).field_1.b = (this->field_1).field_1.c;
  return;
}

Assistant:

void SM83::ld_r_r() {
    LTRACE("LD {}, {}", Get8bitRegisterName<DestRegister>(), Get8bitRegisterName<SrcRegister>());

    u8* dest = Get8bitRegisterPointer<DestRegister>();
    *dest = Get8bitRegister<SrcRegister>();
}